

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool re2::PCRE::Arg::parse_ulong_radix(char *str,int n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  ulong uVar2;
  unsigned_long r;
  char *end;
  char buf [33];
  int radix_local;
  void *dest_local;
  int n_local;
  char *str_local;
  
  if (n == 0) {
    str_local._7_1_ = false;
  }
  else {
    __nptr = TerminateNumber((char *)&end,str,n);
    if (*__nptr == '-') {
      str_local._7_1_ = false;
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0;
      uVar2 = strtoul(__nptr,(char **)&r,radix);
      if ((char *)r == __nptr + n) {
        piVar1 = __errno_location();
        if (*piVar1 == 0) {
          if (dest == (void *)0x0) {
            str_local._7_1_ = true;
          }
          else {
            *(ulong *)dest = uVar2;
            str_local._7_1_ = true;
          }
        }
        else {
          str_local._7_1_ = false;
        }
      }
      else {
        str_local._7_1_ = false;
      }
    }
  }
  return str_local._7_1_;
}

Assistant:

bool PCRE::Arg::parse_ulong_radix(const char* str,
                                int n,
                                void* dest,
                                int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, str, n);
  if (str[0] == '-') {
   // strtoul() will silently accept negative numbers and parse
   // them.  This module is more strict and treats them as errors.
   return false;
  }

  char* end;
  errno = 0;
  unsigned long r = strtoul(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<unsigned long*>(dest)) = r;
  return true;
}